

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_of(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue val;
  JSValue this_obj;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  JSContext *in_RDI;
  long in_R8;
  JSValue JVar4;
  int i;
  JSValue args [1];
  JSValue obj;
  JSContext *ctx_00;
  undefined4 in_stack_ffffffffffffff48;
  JSValueUnion JVar5;
  JSValueUnion ctx_01;
  JSValueUnion JVar6;
  int64_t iVar7;
  undefined8 uVar8;
  undefined4 in_stack_ffffffffffffff80;
  int iVar9;
  undefined4 local_68;
  int in_stack_ffffffffffffff9c;
  undefined4 uVar10;
  JSContext *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  iVar7 = CONCAT44(uStack_c,in_ECX);
  uVar8 = 0;
  JVar4.tag._0_4_ = in_stack_ffffffffffffffb0;
  JVar4.u.ptr = (void *)in_R8;
  JVar4.tag._4_4_ = in_ECX;
  JVar4 = js_typed_array_create
                    (in_stack_ffffffffffffffa0,JVar4,in_stack_ffffffffffffff9c,(JSValue *)0x0);
  ctx_01 = JVar4.u;
  JVar6 = (JSValueUnion)JVar4.tag;
  local_68 = JVar4.u._0_4_;
  uVar10 = JVar4.u._4_4_;
  local_28 = JVar6;
  iVar2 = JS_IsException(JVar4);
  if (iVar2 == 0) {
    iVar2 = 0;
    while (iVar2 < in_ECX) {
      ctx_00 = in_RDI;
      iVar9 = iVar2;
      JVar4 = JS_DupValue(in_RDI,*(JSValue *)(in_R8 + (long)iVar2 * 0x10));
      JVar5 = JVar4.u;
      this_obj.tag._0_4_ = in_stack_ffffffffffffff80;
      this_obj.u = (JSValueUnion)uVar8;
      this_obj.tag._4_4_ = iVar9;
      val.tag = iVar7;
      val.u.float64 = JVar6.float64;
      iVar3 = JS_SetPropertyUint32((JSContext *)ctx_01.ptr,this_obj,JVar4.tag._4_4_,val);
      if (iVar3 < 0) {
        v.u._4_4_ = iVar2;
        v.u.int32 = in_stack_ffffffffffffff48;
        v.tag = (int64_t)JVar5.ptr;
        JS_FreeValue(ctx_00,v);
        local_30 = 0;
        local_28 = 2.96439387504748e-323;
        goto LAB_001c5d90;
      }
      iVar2 = iVar9 + 1;
    }
    local_30 = local_68;
    uStack_2c = uVar10;
  }
  else {
    local_30 = local_68;
    uStack_2c = uVar10;
  }
LAB_001c5d90:
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = (int64_t)local_28;
  return JVar1;
}

Assistant:

static JSValue js_typed_array_of(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj;
    JSValueConst args[1];
    int i;

    args[0] = JS_NewInt32(ctx, argc);
    obj = js_typed_array_create(ctx, this_val, 1, args);
    if (JS_IsException(obj))
        return obj;

    for(i = 0; i < argc; i++) {
        if (JS_SetPropertyUint32(ctx, obj, i, JS_DupValue(ctx, argv[i])) < 0) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    }
    return obj;
}